

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O3

t_int * vinlet_perform(t_int *w)

{
  undefined4 uVar1;
  long lVar2;
  t_int tVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  
  lVar2 = w[1];
  tVar3 = w[3];
  puVar5 = *(undefined4 **)(lVar2 + 0x60);
  if ((int)tVar3 != 0) {
    lVar4 = w[2];
    lVar6 = 0;
    do {
      uVar1 = *puVar5;
      puVar5 = puVar5 + 1;
      *(undefined4 *)(lVar4 + lVar6 * 4) = uVar1;
      lVar6 = lVar6 + 1;
    } while ((int)tVar3 != (int)lVar6);
  }
  if (puVar5 == *(undefined4 **)(lVar2 + 0x50)) {
    puVar5 = *(undefined4 **)(lVar2 + 0x48);
  }
  *(undefined4 **)(lVar2 + 0x60) = puVar5;
  return w + 4;
}

Assistant:

t_int *vinlet_perform(t_int *w)
{
    t_vinlet *x = (t_vinlet *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    t_sample *in = x->x_read;
    while (n--) *out++ = *in++;
    if (in == x->x_endbuf) in = x->x_buf;
    x->x_read = in;
    return (w+4);
}